

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pkey.cc
# Opt level: O2

EVP_PKEY * PEM_read_bio_PrivateKey(BIO *bp,EVP_PKEY **x,undefined1 *cb,void *u)

{
  char *__s1;
  int iVar1;
  uint passlen;
  X509_SIG *a;
  PKCS8_PRIV_KEY_INFO *p8;
  EVP_PKEY *pEVar2;
  long len;
  uchar *local_450;
  uchar *data;
  char *nm;
  char psbuf [1024];
  
  nm = (char *)0x0;
  data = (uchar *)0x0;
  iVar1 = PEM_bytes_read_bio(&data,&len,&nm,"ANY PRIVATE KEY",bp,cb,u);
  __s1 = nm;
  if (iVar1 == 0) {
    return (EVP_PKEY *)0x0;
  }
  local_450 = data;
  iVar1 = strcmp(nm,"PRIVATE KEY");
  if (iVar1 == 0) {
    p8 = d2i_PKCS8_PRIV_KEY_INFO((PKCS8_PRIV_KEY_INFO **)0x0,&local_450,len);
    if (p8 != (PKCS8_PRIV_KEY_INFO *)0x0) {
LAB_0025c7aa:
      pEVar2 = EVP_PKCS82PKEY(p8);
      if (x != (EVP_PKEY **)0x0) {
        if (*x != (EVP_PKEY *)0x0) {
          EVP_PKEY_free(*x);
        }
        *x = pEVar2;
      }
      PKCS8_PRIV_KEY_INFO_free(p8);
      goto LAB_0025c87d;
    }
  }
  else {
    iVar1 = strcmp(__s1,"ENCRYPTED PRIVATE KEY");
    if (iVar1 == 0) {
      pEVar2 = (EVP_PKEY *)0x0;
      a = d2i_X509_SIG((X509_SIG **)0x0,&local_450,len);
      if (a != (X509_SIG *)0x0) {
        if (cb == (undefined1 *)0x0) {
          cb = PEM_def_callback;
        }
        passlen = (*(code *)cb)(psbuf,0x400,0,u);
        if ((int)passlen < 0) {
          pEVar2 = (EVP_PKEY *)0x0;
          ERR_put_error(9,0,0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pkey.cc"
                        ,0x48);
          X509_SIG_free(a);
          goto LAB_0025c89d;
        }
        p8 = PKCS8_decrypt(a,psbuf,passlen);
        X509_SIG_free(a);
        OPENSSL_cleanse(psbuf,(ulong)passlen);
        if (p8 != (PKCS8_PRIV_KEY_INFO *)0x0) goto LAB_0025c7aa;
        pEVar2 = (EVP_PKEY *)0x0;
      }
    }
    else {
      iVar1 = strcmp(__s1,"RSA PRIVATE KEY");
      if (iVar1 == 0) {
        iVar1 = 6;
      }
      else {
        iVar1 = strcmp(__s1,"EC PRIVATE KEY");
        if (iVar1 == 0) {
          iVar1 = 0x198;
        }
        else {
          iVar1 = strcmp(__s1,"DSA PRIVATE KEY");
          if (iVar1 != 0) goto LAB_0025c882;
          iVar1 = 0x74;
        }
      }
      pEVar2 = d2i_PrivateKey(iVar1,x,&local_450,len);
    }
LAB_0025c87d:
    if (pEVar2 != (EVP_PKEY *)0x0) goto LAB_0025c89d;
  }
LAB_0025c882:
  pEVar2 = (EVP_PKEY *)0x0;
  ERR_put_error(9,0,0xc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pkey.cc"
                ,0x66);
LAB_0025c89d:
  OPENSSL_free(nm);
  OPENSSL_free(data);
  return pEVar2;
}

Assistant:

EVP_PKEY *PEM_read_bio_PrivateKey(BIO *bp, EVP_PKEY **x, pem_password_cb *cb,
                                  void *u) {
  char *nm = NULL;
  const unsigned char *p = NULL;
  unsigned char *data = NULL;
  long len;
  EVP_PKEY *ret = NULL;

  if (!PEM_bytes_read_bio(&data, &len, &nm, PEM_STRING_EVP_PKEY, bp, cb, u)) {
    return NULL;
  }
  p = data;

  if (strcmp(nm, PEM_STRING_PKCS8INF) == 0) {
    PKCS8_PRIV_KEY_INFO *p8inf;
    p8inf = d2i_PKCS8_PRIV_KEY_INFO(NULL, &p, len);
    if (!p8inf) {
      goto p8err;
    }
    ret = EVP_PKCS82PKEY(p8inf);
    if (x) {
      if (*x) {
        EVP_PKEY_free((EVP_PKEY *)*x);
      }
      *x = ret;
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
  } else if (strcmp(nm, PEM_STRING_PKCS8) == 0) {
    PKCS8_PRIV_KEY_INFO *p8inf;
    X509_SIG *p8;
    int pass_len;
    char psbuf[PEM_BUFSIZE];
    p8 = d2i_X509_SIG(NULL, &p, len);
    if (!p8) {
      goto p8err;
    }

    pass_len = 0;
    if (!cb) {
      cb = PEM_def_callback;
    }
    pass_len = cb(psbuf, PEM_BUFSIZE, 0, u);
    if (pass_len < 0) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_PASSWORD_READ);
      X509_SIG_free(p8);
      goto err;
    }
    p8inf = PKCS8_decrypt(p8, psbuf, pass_len);
    X509_SIG_free(p8);
    OPENSSL_cleanse(psbuf, pass_len);
    if (!p8inf) {
      goto p8err;
    }
    ret = EVP_PKCS82PKEY(p8inf);
    if (x) {
      if (*x) {
        EVP_PKEY_free((EVP_PKEY *)*x);
      }
      *x = ret;
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
  } else if (strcmp(nm, PEM_STRING_RSA) == 0) {
    // TODO(davidben): d2i_PrivateKey parses PKCS#8 along with the
    // standalone format. This and the cases below probably should not
    // accept PKCS#8.
    ret = d2i_PrivateKey(EVP_PKEY_RSA, x, &p, len);
  } else if (strcmp(nm, PEM_STRING_EC) == 0) {
    ret = d2i_PrivateKey(EVP_PKEY_EC, x, &p, len);
  } else if (strcmp(nm, PEM_STRING_DSA) == 0) {
    ret = d2i_PrivateKey(EVP_PKEY_DSA, x, &p, len);
  }
p8err:
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_ASN1_LIB);
  }

err:
  OPENSSL_free(nm);
  OPENSSL_free(data);
  return ret;
}